

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O1

_Bool duckdb_je_pac_retain_grow_limit_get_set
                (tsdn_t *tsdn,pac_t *pac,size_t *old_limit,size_t *new_limit)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  uint extraout_EAX;
  undefined8 in_RAX;
  pszind_t local_34;
  
  local_34 = 0;
  if (new_limit != (size_t *)0x0) {
    duckdb_je_pac_retain_grow_limit_get_set_cold_1();
    if ((extraout_EAX & 1) == 0) {
      return true;
    }
    local_34 = (pszind_t)((ulong)in_RAX >> 0x20);
  }
  __mutex = (pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pac->grow_mtx);
    (pac->grow_mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(pac->grow_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((pac->grow_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (pac->grow_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(pac->grow_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (old_limit != (size_t *)0x0) {
    *old_limit = duckdb_je_sz_pind2sz_tab[(pac->exp_grow).limit];
  }
  if (new_limit != (size_t *)0x0) {
    (pac->exp_grow).limit = local_34;
  }
  (pac->grow_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return false;
}

Assistant:

bool
pac_retain_grow_limit_get_set(tsdn_t *tsdn, pac_t *pac, size_t *old_limit,
    size_t *new_limit) {
	pszind_t new_ind JEMALLOC_CC_SILENCE_INIT(0);
	if (new_limit != NULL) {
		size_t limit = *new_limit;
		/* Grow no more than the new limit. */
		if ((new_ind = sz_psz2ind(limit + 1) - 1) >= SC_NPSIZES) {
			return true;
		}
	}

	malloc_mutex_lock(tsdn, &pac->grow_mtx);
	if (old_limit != NULL) {
		*old_limit = sz_pind2sz(pac->exp_grow.limit);
	}
	if (new_limit != NULL) {
		pac->exp_grow.limit = new_ind;
	}
	malloc_mutex_unlock(tsdn, &pac->grow_mtx);

	return false;
}